

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int amqp_simple_wait_frame_noblock
              (amqp_connection_state_t state,amqp_frame_t *decoded_frame,timeval *timeout)

{
  amqp_link_t *paVar1;
  amqp_link_t_ *paVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  uint64_t in_RAX;
  amqp_time_t deadline;
  amqp_time_t local_18;
  
  local_18.time_point_ns = in_RAX;
  iVar9 = amqp_time_from_now(&local_18,timeout);
  if (iVar9 == 0) {
    paVar1 = state->first_queued_frame;
    if (paVar1 == (amqp_link_t *)0x0) {
      iVar9 = wait_frame_inner(state,decoded_frame,local_18);
    }
    else {
      paVar2 = paVar1->next;
      puVar3 = (undefined8 *)paVar1->data;
      state->first_queued_frame = paVar2;
      if (paVar2 == (amqp_link_t_ *)0x0) {
        state->last_queued_frame = (amqp_link_t *)0x0;
      }
      uVar4 = *puVar3;
      sVar5 = puVar3[1];
      pvVar6 = (void *)puVar3[2];
      pvVar7 = (void *)puVar3[3];
      pvVar8 = (void *)puVar3[5];
      (decoded_frame->payload).properties.raw.len = puVar3[4];
      (decoded_frame->payload).properties.raw.bytes = pvVar8;
      (decoded_frame->payload).method.decoded = pvVar6;
      (decoded_frame->payload).properties.decoded = pvVar7;
      decoded_frame->frame_type = (char)uVar4;
      decoded_frame->field_0x1 = (char)((ulong)uVar4 >> 8);
      decoded_frame->channel = (short)((ulong)uVar4 >> 0x10);
      *(int *)&decoded_frame->field_0x4 = (int)((ulong)uVar4 >> 0x20);
      (decoded_frame->payload).body_fragment.len = sVar5;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int amqp_simple_wait_frame_noblock(amqp_connection_state_t state,
                                   amqp_frame_t *decoded_frame,
                                   const struct timeval *timeout) {
  amqp_time_t deadline;

  int res = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  if (state->first_queued_frame != NULL) {
    amqp_frame_t *f = (amqp_frame_t *)state->first_queued_frame->data;
    state->first_queued_frame = state->first_queued_frame->next;
    if (state->first_queued_frame == NULL) {
      state->last_queued_frame = NULL;
    }
    *decoded_frame = *f;
    return AMQP_STATUS_OK;
  } else {
    return wait_frame_inner(state, decoded_frame, deadline);
  }
}